

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Abc_Nam_t * Acb_VerilogStartNames(void)

{
  int iVar1;
  undefined8 in_RAX;
  Abc_Nam_t *p;
  char *pStr;
  int iVar2;
  undefined8 uStack_38;
  int fFound;
  
  uStack_38 = in_RAX;
  p = Abc_NamStart(100,0x10);
  iVar2 = 1;
  do {
    pStr = "module";
    switch(iVar2) {
    case 1:
      break;
    case 2:
      pStr = "endmodule";
      break;
    case 3:
      pStr = "input";
      break;
    case 4:
      pStr = "output";
      break;
    case 5:
      pStr = "wire";
      break;
    case 6:
      pStr = "buf";
      break;
    case 7:
      pStr = "not";
      break;
    case 8:
      pStr = "and";
      break;
    case 9:
      pStr = "nand";
      break;
    case 10:
      pStr = "or";
      break;
    case 0xb:
      pStr = "nor";
      break;
    case 0xc:
      pStr = "xor";
      break;
    case 0xd:
      pStr = "xnor";
      break;
    case 0xe:
      return p;
    default:
      pStr = (char *)0x0;
    }
    iVar1 = Abc_NamStrFindOrAdd(p,pStr,&fFound);
    if (iVar2 != iVar1) break;
    iVar2 = iVar2 + 1;
  } while (fFound == 0);
  __assert_fail("i == NameId && !fFound",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                ,0xb0,"Abc_Nam_t *Acb_VerilogStartNames()");
}

Assistant:

Abc_Nam_t * Acb_VerilogStartNames()
{
    Abc_Nam_t * pNames = Abc_NamStart( 100, 16 ); 
    int i, NameId, fFound;
    for ( i = 1; i < ACB_UNUSED; i++ )
    {
        NameId = Abc_NamStrFindOrAdd( pNames, Acb_Num2Name(i), &fFound );
        assert( i == NameId && !fFound );
    }
    return pNames;
}